

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ResetAllSchemasOfConnection(sqlite3 *db)

{
  void *p;
  VTable *pVVar1;
  int iVar2;
  VTable *pVTab;
  long lVar3;
  long lVar4;
  
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  iVar2 = db->nDb;
  if (0 < iVar2) {
    lVar3 = 0x18;
    lVar4 = 0;
    do {
      p = *(void **)((long)&db->aDb->zDbSName + lVar3);
      if (p != (void *)0x0) {
        if (db->nSchemaLock == 0) {
          sqlite3SchemaClear(p);
          iVar2 = db->nDb;
        }
        else {
          *(byte *)((long)p + 0x72) = *(byte *)((long)p + 0x72) | 8;
        }
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar4 < iVar2);
  }
  *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xee;
  pVTab = db->pDisconnect;
  if (pVTab != (VTable *)0x0) {
    db->pDisconnect = (VTable *)0x0;
    do {
      pVVar1 = pVTab->pNext;
      sqlite3VtabUnlock(pVTab);
      pVTab = pVVar1;
    } while (pVVar1 != (VTable *)0x0);
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  if (db->nSchemaLock != 0) {
    return;
  }
  sqlite3CollapseDatabaseArray(db);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResetAllSchemasOfConnection(sqlite3 *db){
  int i;
  sqlite3BtreeEnterAll(db);
  for(i=0; i<db->nDb; i++){
    Db *pDb = &db->aDb[i];
    if( pDb->pSchema ){
      if( db->nSchemaLock==0 ){
        sqlite3SchemaClear(pDb->pSchema);
      }else{
        DbSetProperty(db, i, DB_ResetWanted);
      }
    }
  }
  db->mDbFlags &= ~(DBFLAG_SchemaChange|DBFLAG_SchemaKnownOk);
  sqlite3VtabUnlockList(db);
  sqlite3BtreeLeaveAll(db);
  if( db->nSchemaLock==0 ){
    sqlite3CollapseDatabaseArray(db);
  }
}